

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

void Gia_ManEraFree(Gia_ManEra_t *p)

{
  Vec_Int_t *pVVar1;
  int *__ptr;
  Vec_Ptr_t *__ptr_00;
  void **__ptr_01;
  
  Mem_FixedStop(p->pMemory,0);
  pVVar1 = p->vStgDump;
  __ptr = pVVar1->pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(pVVar1);
  __ptr_00 = p->vStates;
  __ptr_01 = __ptr_00->pArray;
  if (__ptr_01 != (void **)0x0) {
    free(__ptr_01);
  }
  free(__ptr_00);
  pVVar1 = p->vBugTrace;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pBins != (uint *)0x0) {
    free(p->pBins);
  }
  free(p);
  return;
}

Assistant:

void Gia_ManEraFree( Gia_ManEra_t * p )
{
    Mem_FixedStop( p->pMemory, 0 );
    Vec_IntFree( p->vStgDump );
    Vec_PtrFree( p->vStates );
    if ( p->vBugTrace ) Vec_IntFree( p->vBugTrace );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}